

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

void run_container_grow(run_container_t *run,int32_t min,_Bool copy)

{
  void *pvVar1;
  byte in_DL;
  int in_ESI;
  long in_RDI;
  rle16_t *oldruns;
  int32_t newCapacity;
  size_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_14;
  
  if (*(int *)(in_RDI + 4) == 0) {
    local_24 = 0;
  }
  else {
    if (*(int *)(in_RDI + 4) < 0x40) {
      local_28 = *(int *)(in_RDI + 4) << 1;
    }
    else if (*(int *)(in_RDI + 4) < 0x400) {
      in_stack_ffffffffffffffd4 = (*(int *)(in_RDI + 4) * 3) / 2;
      local_28 = in_stack_ffffffffffffffd4;
    }
    else {
      in_stack_ffffffffffffffd4 = (*(int *)(in_RDI + 4) * 5) / 4;
      local_28 = in_stack_ffffffffffffffd4;
    }
    local_24 = local_28;
  }
  local_14 = local_24;
  if (local_24 < in_ESI) {
    local_14 = in_ESI;
  }
  *(int *)(in_RDI + 4) = local_14;
  if ((in_DL & 1) == 0) {
    roaring_free((void *)0x158f41);
    pvVar1 = roaring_malloc(0x158f53);
    *(void **)(in_RDI + 8) = pvVar1;
  }
  else {
    pvVar1 = roaring_realloc((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffc8);
    *(void **)(in_RDI + 8) = pvVar1;
    if (*(long *)(in_RDI + 8) == 0) {
      roaring_free((void *)0x158f31);
    }
  }
  return;
}

Assistant:

void run_container_grow(run_container_t *run, int32_t min, bool copy) {
    int32_t newCapacity = (run->capacity == 0)   ? RUN_DEFAULT_INIT_SIZE
                          : run->capacity < 64   ? run->capacity * 2
                          : run->capacity < 1024 ? run->capacity * 3 / 2
                                                 : run->capacity * 5 / 4;
    if (newCapacity < min) newCapacity = min;
    run->capacity = newCapacity;
    assert(run->capacity >= min);
    if (copy) {
        rle16_t *oldruns = run->runs;
        run->runs = (rle16_t *)roaring_realloc(oldruns,
                                               run->capacity * sizeof(rle16_t));
        if (run->runs == NULL) roaring_free(oldruns);
    } else {
        roaring_free(run->runs);
        run->runs = (rle16_t *)roaring_malloc(run->capacity * sizeof(rle16_t));
    }
    // We may have run->runs == NULL.
}